

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formula.cpp
# Opt level: O2

Formula * Kernel::Formula::falseFormula(void)

{
  int iVar1;
  
  if (falseFormula()::res == '\0') {
    iVar1 = __cxa_guard_acquire(&falseFormula()::res);
    if (iVar1 != 0) {
      falseFormula::res = (Formula *)operator_new(0x28);
      falseFormula::res->_connective = FALSE;
      (falseFormula::res->_label)._M_dataplus._M_p = (pointer)&(falseFormula::res->_label).field_2;
      (falseFormula::res->_label)._M_string_length = 0;
      (falseFormula::res->_label).field_2._M_local_buf[0] = '\0';
      __cxa_guard_release(&falseFormula()::res);
    }
  }
  return falseFormula::res;
}

Assistant:

Formula* Formula::falseFormula()
{
  static Formula* res = new Formula(false);
  return res;
}